

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Edits::Iterator::destinationIndexFromSourceIndex
          (Iterator *this,int32_t i,UErrorCode *errorCode)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = findIndex(this,i,'\x01',errorCode);
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  else if ((iVar1 == 0) && (iVar2 = i - this->srcIndex, iVar2 != 0)) {
    if (this->changed == '\0') {
      iVar1 = this->destIndex + iVar2;
    }
    else {
      iVar1 = this->destIndex + this->newLength_;
    }
  }
  else {
    iVar1 = this->destIndex;
  }
  return iVar1;
}

Assistant:

int32_t Edits::Iterator::destinationIndexFromSourceIndex(int32_t i, UErrorCode &errorCode) {
    int32_t where = findIndex(i, TRUE, errorCode);
    if (where < 0) {
        // Error or before the string.
        return 0;
    }
    if (where > 0 || i == srcIndex) {
        // At or after string length, or at start of the found span.
        return destIndex;
    }
    if (changed) {
        // In a change span, map to its end.
        return destIndex + newLength_;
    } else {
        // In an unchanged span, offset 1:1 within it.
        return destIndex + (i - srcIndex);
    }
}